

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridAxisIrregular.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::GridAxisIrregular::GridAxisIrregular
          (GridAxisIrregular *this,KFLOAT64 InitialXi,KFLOAT64 FinalXi,KUINT16 PointsXi,
          KUINT8 InterleafFactor,KUINT8 AxisType,KDataStream *stream)

{
  ushort uVar1;
  byte bVar2;
  KUINT16 i;
  ushort uVar3;
  KUINT16 ui16TmpVal;
  unsigned_short local_3a;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *local_38;
  
  GridAxisRegular::GridAxisRegular
            (&this->super_GridAxisRegular,InitialXi,FinalXi,PointsXi,InterleafFactor,AxisType,stream
            );
  (this->super_GridAxisRegular).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__GridAxisIrregular_00218b48;
  local_38 = &this->m_vXiValues;
  (this->m_vXiValues).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vXiValues).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vXiValues).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_vui16Padding).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vui16Padding).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vui16Padding).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  KDataStream::Read<double>(stream,(double *)&this->m_f64CoordScaleXi);
  KDataStream::Read<double>(stream,(double *)&this->m_f64CoordOffsetXi);
  local_3a = 0;
  for (uVar3 = 0; uVar1 = (this->super_GridAxisRegular).m_ui16NumPoints, uVar3 < uVar1;
      uVar3 = uVar3 + 1) {
    KDataStream::Read<unsigned_short>(stream,&local_3a);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back(local_38,&local_3a);
  }
  for (bVar2 = 0; bVar2 < ((byte)uVar1 & 3); bVar2 = bVar2 + 1) {
    KDataStream::Read<unsigned_short>(stream,&local_3a);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
              (&this->m_vui16Padding,&local_3a);
  }
  return;
}

Assistant:

GridAxisIrregular::GridAxisIrregular( KFLOAT64 InitialXi, KFLOAT64 FinalXi, KUINT16 PointsXi, KUINT8 InterleafFactor,
                                      KUINT8 AxisType, KDataStream & stream ) :
    GridAxisRegular( InitialXi, FinalXi, PointsXi, InterleafFactor, AxisType, stream )
{
    stream >> m_f64CoordScaleXi
           >> m_f64CoordOffsetXi;

    KUINT16 ui16TmpVal = 0;
    for( KUINT16 i = 0; i < m_ui16NumPoints; ++i )
    {
        stream >> ui16TmpVal;
        m_vXiValues.push_back( ui16TmpVal );
    }

    // Calculate the padding that needs to be extracted. 64 bit boundary
    KUINT8 NumPadding = m_ui16NumPoints % 4;
    for( KUINT8 i = 0; i < NumPadding; ++i )
    {
        stream >> ui16TmpVal;
        m_vui16Padding.push_back( ui16TmpVal );
    }
}